

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

bool __thiscall branch_and_reduce_algorithm::dinicDFS(branch_and_reduce_algorithm *this,int v)

{
  uint uVar1;
  int iVar2;
  pointer pvVar3;
  bool bVar4;
  pointer piVar5;
  pointer piVar6;
  
  piVar5 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = piVar5[v];
  do {
    if ((int)uVar1 < 0) {
      return false;
    }
    pvVar3 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar5[v] = uVar1 - 1;
    iVar2 = *(int *)(*(long *)&pvVar3[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + (ulong)uVar1 * 4);
    if ((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2] < 0) {
      piVar6 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = piVar6[iVar2];
      if ((int)uVar1 < 0) {
LAB_0010b566:
        piVar6[iVar2] = v;
        (this->out).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[v] = iVar2;
        return true;
      }
      piVar6 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((piVar6[v] < piVar6[uVar1]) && (-1 < piVar5[uVar1])) {
        bVar4 = dinicDFS(this,uVar1);
        if (bVar4) {
          piVar6 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          goto LAB_0010b566;
        }
        piVar5 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
    }
    uVar1 = piVar5[v];
  } while( true );
}

Assistant:

bool branch_and_reduce_algorithm::dinicDFS(int v)
{
    while (iter[v] >= 0)
    {
        int u = adj[v][iter[v]--], w = in[u];
        if (x[u] >= 0)
            continue;
        if (w < 0 || (level[v] < level[w] && iter[w] >= 0 && dinicDFS(w)))
        {
            in[u] = v;
            out[v] = u;
            return true;
        }
    }
    return false;
}